

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  xmlParserErrors code;
  int len;
  int iVar5;
  xmlChar *pxVar6;
  xmlSBuf buf;
  char *pcVar7;
  xmlSBuf local_48;
  
  local_48.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_48.max = 10000000;
  }
  local_48.mem = (xmlChar *)0x0;
  local_48.size = 0;
  local_48.cap = 0;
  local_48.code = XML_ERR_OK;
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar6 = ctxt->input->cur;
  xVar1 = *pxVar6;
  if ((xVar1 == '\"') || (xVar1 == '\'')) {
    ctxt->input->cur = pxVar6 + 1;
    len = 0;
    do {
      iVar5 = 4;
      if (ctxt->disableSAX < 2) {
        pxVar3 = ctxt->input;
        pxVar6 = pxVar3->cur;
        if (pxVar6 < pxVar3->end) {
          xVar2 = *pxVar6;
          if (xVar2 != '\0') {
            iVar5 = 3;
            if (xVar2 != xVar1) {
              if (xVar2 == '\n') {
                pxVar3->line = pxVar3->line + 1;
                pxVar3->col = 1;
              }
              else {
                pxVar3->col = pxVar3->col + 1;
              }
              pxVar3->cur = pxVar6 + 1;
              len = len + 1;
              iVar5 = 0;
              if (((long)pxVar3->end - (long)(pxVar6 + 1) < 10) && ((pxVar3->flags & 0x40) == 0)) {
                xmlParserGrow(ctxt);
              }
            }
            goto LAB_00133ad9;
          }
          pcVar7 = "invalid character in entity value\n";
          code = XML_ERR_INVALID_CHAR;
        }
        else {
          pcVar7 = (char *)0x0;
          code = XML_ERR_ENTITY_NOT_FINISHED;
        }
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                   (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar7);
      }
LAB_00133ad9:
    } while (iVar5 == 0);
    if (iVar5 == 4) {
      (*xmlFree)(local_48.mem);
      orig = (xmlChar **)0x0;
    }
    else if (iVar5 == 3) {
      pxVar6 = ctxt->input->cur + -(long)len;
      if (orig != (xmlChar **)0x0) {
        pxVar4 = xmlStrndup(pxVar6,len);
        *orig = pxVar4;
        if (pxVar4 == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
        }
      }
      xmlExpandPEsInEntityValue(ctxt,&local_48,pxVar6,len,ctxt->inputNr);
      pxVar3 = ctxt->input;
      if (*pxVar3->cur == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      pxVar3->cur = pxVar3->cur + 1;
      orig = (xmlChar **)xmlSBufFinish(&local_48,(int *)0x0,ctxt,"entity length too long");
    }
  }
  else {
    orig = (xmlChar **)0x0;
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)orig;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    const xmlChar *start;
    int quote, length;

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    CUR_PTR++;

    length = 0;

    /*
     * Copy raw content of the entity into a buffer
     */
    while (1) {
        int c;

        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
            goto error;
        }

        c = CUR;

        if (c == 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                    "invalid character in entity value\n");
            goto error;
        }
        if (c == quote)
            break;
        NEXTL(1);
        length += 1;

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;
    }

    start = CUR_PTR - length;

    if (orig != NULL) {
        *orig = xmlStrndup(start, length);
        if (*orig == NULL)
            xmlErrMemory(ctxt);
    }

    xmlExpandPEsInEntityValue(ctxt, &buf, start, length, ctxt->inputNr);

    NEXTL(1);

    return(xmlSBufFinish(&buf, NULL, ctxt, "entity length too long"));

error:
    xmlSBufCleanup(&buf, ctxt, "entity length too long");
    return(NULL);
}